

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef llvm::Triple::getArchTypeName(ArchType Kind)

{
  undefined1 auStack_348 [4];
  ArchType Kind_local;
  char *local_338;
  undefined1 *local_330;
  char *local_328;
  undefined1 *local_320;
  char *local_318;
  undefined1 *local_310;
  char *local_308;
  undefined1 *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  undefined1 *local_290;
  char *local_288;
  undefined1 *local_280;
  char *local_278;
  undefined1 *local_270;
  char *local_268;
  undefined1 *local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined1 *local_240;
  char *local_238;
  undefined1 *local_230;
  char *local_228;
  undefined1 *local_220;
  char *local_218;
  undefined1 *local_210;
  char *local_208;
  undefined1 *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 *local_190;
  char *local_188;
  undefined1 *local_180;
  char *local_178;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  char *local_148;
  undefined1 *local_140;
  char *local_138;
  undefined1 *local_130;
  char *local_128;
  undefined1 *local_120;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  switch(Kind) {
  case UnknownArch:
    local_330 = auStack_348;
    local_338 = "unknown";
    strlen("unknown");
    break;
  case arm:
    local_300 = auStack_348;
    local_308 = "arm";
    strlen("arm");
    break;
  case armeb:
    local_2f0 = auStack_348;
    local_2f8 = "armeb";
    strlen("armeb");
    break;
  case aarch64:
    local_320 = auStack_348;
    local_328 = "aarch64";
    strlen("aarch64");
    break;
  case aarch64_be:
    local_310 = auStack_348;
    local_318 = "aarch64_be";
    strlen("aarch64_be");
    break;
  case arc:
    local_2e0 = auStack_348;
    local_2e8 = "arc";
    strlen("arc");
    break;
  case avr:
    local_2d0 = auStack_348;
    local_2d8 = "avr";
    strlen("avr");
    break;
  case bpfel:
    local_2c0 = auStack_348;
    local_2c8 = "bpfel";
    strlen("bpfel");
    break;
  case bpfeb:
    local_2b0 = auStack_348;
    local_2b8 = "bpfeb";
    strlen("bpfeb");
    break;
  case hexagon:
    local_2a0 = auStack_348;
    local_2a8 = "hexagon";
    strlen("hexagon");
    break;
  case mips:
    local_290 = auStack_348;
    local_298 = "mips";
    strlen("mips");
    break;
  case mipsel:
    local_280 = auStack_348;
    local_288 = "mipsel";
    strlen("mipsel");
    break;
  case mips64:
    local_270 = auStack_348;
    local_278 = "mips64";
    strlen("mips64");
    break;
  case mips64el:
    local_260 = auStack_348;
    local_268 = "mips64el";
    strlen("mips64el");
    break;
  case msp430:
    local_250 = auStack_348;
    local_258 = "msp430";
    strlen("msp430");
    break;
  case nios2:
    local_240 = auStack_348;
    local_248 = "nios2";
    strlen("nios2");
    break;
  case ppc:
    local_210 = auStack_348;
    local_218 = "powerpc";
    strlen("powerpc");
    break;
  case ppc64:
    local_230 = auStack_348;
    local_238 = "powerpc64";
    strlen("powerpc64");
    break;
  case ppc64le:
    local_220 = auStack_348;
    local_228 = "powerpc64le";
    strlen("powerpc64le");
    break;
  case r600:
    local_200 = auStack_348;
    local_208 = "r600";
    strlen("r600");
    break;
  case amdgcn:
    local_1f0 = auStack_348;
    local_1f8 = "amdgcn";
    strlen("amdgcn");
    break;
  case riscv32:
    local_1e0 = auStack_348;
    local_1e8 = "riscv32";
    strlen("riscv32");
    break;
  case riscv64:
    local_1d0 = auStack_348;
    local_1d8 = "riscv64";
    strlen("riscv64");
    break;
  case sparc:
    local_1c0 = auStack_348;
    local_1c8 = "sparc";
    strlen("sparc");
    break;
  case sparcv9:
    local_1b0 = auStack_348;
    local_1b8 = "sparcv9";
    strlen("sparcv9");
    break;
  case sparcel:
    local_1a0 = auStack_348;
    local_1a8 = "sparcel";
    strlen("sparcel");
    break;
  case systemz:
    local_190 = auStack_348;
    local_198 = "s390x";
    strlen("s390x");
    break;
  case tce:
    local_180 = auStack_348;
    local_188 = "tce";
    strlen("tce");
    break;
  case tcele:
    local_170 = auStack_348;
    local_178 = "tcele";
    strlen("tcele");
    break;
  case thumb:
    local_160 = auStack_348;
    local_168 = "thumb";
    strlen("thumb");
    break;
  case thumbeb:
    local_150 = auStack_348;
    local_158 = "thumbeb";
    strlen("thumbeb");
    break;
  case x86:
    local_140 = auStack_348;
    local_148 = "i386";
    strlen("i386");
    break;
  case x86_64:
    local_130 = auStack_348;
    local_138 = "x86_64";
    strlen("x86_64");
    break;
  case xcore:
    local_120 = auStack_348;
    local_128 = "xcore";
    strlen("xcore");
    break;
  case nvptx:
    local_110 = auStack_348;
    local_118 = "nvptx";
    strlen("nvptx");
    break;
  case nvptx64:
    local_100 = auStack_348;
    local_108 = "nvptx64";
    strlen("nvptx64");
    break;
  case le32:
    local_f0 = auStack_348;
    local_f8 = "le32";
    strlen("le32");
    break;
  case le64:
    local_e0 = auStack_348;
    local_e8 = "le64";
    strlen("le64");
    break;
  case amdil:
    local_d0 = auStack_348;
    local_d8 = "amdil";
    strlen("amdil");
    break;
  case amdil64:
    local_c0 = auStack_348;
    local_c8 = "amdil64";
    strlen("amdil64");
    break;
  case hsail:
    local_b0 = auStack_348;
    local_b8 = "hsail";
    strlen("hsail");
    break;
  case hsail64:
    local_a0 = auStack_348;
    local_a8 = "hsail64";
    strlen("hsail64");
    break;
  case spir:
    local_90 = auStack_348;
    local_98 = "spir";
    strlen("spir");
    break;
  case spir64:
    local_80 = auStack_348;
    local_88 = "spir64";
    strlen("spir64");
    break;
  case kalimba:
    local_70 = auStack_348;
    local_78 = "kalimba";
    strlen("kalimba");
    break;
  case shave:
    local_50 = auStack_348;
    local_58 = "shave";
    strlen("shave");
    break;
  case lanai:
    local_60 = auStack_348;
    local_68 = "lanai";
    strlen("lanai");
    break;
  case wasm32:
    local_40 = auStack_348;
    local_48 = "wasm32";
    strlen("wasm32");
    break;
  case wasm64:
    local_30 = auStack_348;
    local_38 = "wasm64";
    strlen("wasm64");
    break;
  case renderscript32:
    local_20 = auStack_348;
    local_28 = "renderscript32";
    strlen("renderscript32");
    break;
  case LastArchType:
    local_10 = auStack_348;
    local_18 = "renderscript64";
    strlen("renderscript64");
    break;
  default:
    llvm_unreachable_internal
              ("Invalid ArchType!",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x4c);
  }
  return _auStack_348;
}

Assistant:

StringRef Triple::getArchTypeName(ArchType Kind) {
  switch (Kind) {
  case UnknownArch:    return "unknown";

  case aarch64:        return "aarch64";
  case aarch64_be:     return "aarch64_be";
  case arm:            return "arm";
  case armeb:          return "armeb";
  case arc:            return "arc";
  case avr:            return "avr";
  case bpfel:          return "bpfel";
  case bpfeb:          return "bpfeb";
  case hexagon:        return "hexagon";
  case mips:           return "mips";
  case mipsel:         return "mipsel";
  case mips64:         return "mips64";
  case mips64el:       return "mips64el";
  case msp430:         return "msp430";
  case nios2:          return "nios2";
  case ppc64:          return "powerpc64";
  case ppc64le:        return "powerpc64le";
  case ppc:            return "powerpc";
  case r600:           return "r600";
  case amdgcn:         return "amdgcn";
  case riscv32:        return "riscv32";
  case riscv64:        return "riscv64";
  case sparc:          return "sparc";
  case sparcv9:        return "sparcv9";
  case sparcel:        return "sparcel";
  case systemz:        return "s390x";
  case tce:            return "tce";
  case tcele:          return "tcele";
  case thumb:          return "thumb";
  case thumbeb:        return "thumbeb";
  case x86:            return "i386";
  case x86_64:         return "x86_64";
  case xcore:          return "xcore";
  case nvptx:          return "nvptx";
  case nvptx64:        return "nvptx64";
  case le32:           return "le32";
  case le64:           return "le64";
  case amdil:          return "amdil";
  case amdil64:        return "amdil64";
  case hsail:          return "hsail";
  case hsail64:        return "hsail64";
  case spir:           return "spir";
  case spir64:         return "spir64";
  case kalimba:        return "kalimba";
  case lanai:          return "lanai";
  case shave:          return "shave";
  case wasm32:         return "wasm32";
  case wasm64:         return "wasm64";
  case renderscript32: return "renderscript32";
  case renderscript64: return "renderscript64";
  }

  llvm_unreachable("Invalid ArchType!");
}